

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

bool __thiscall
capnp::compiler::NodeTranslator::compileType
          (NodeTranslator *this,Reader source,Builder target,ImplicitParams implicitMethodParams)

{
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *other;
  BrandedDecl *pBVar1;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_178;
  undefined1 local_c8 [8];
  NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> decl;
  NodeTranslator *this_local;
  
  decl.field_1._160_8_ = this;
  compileDeclExpression(&local_178,this,source,implicitMethodParams);
  other = kj::_::readMaybe<capnp::compiler::NodeTranslator::BrandedDecl>(&local_178);
  kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::NullableValue
            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_c8,other);
  kj::Maybe<capnp::compiler::NodeTranslator::BrandedDecl>::~Maybe(&local_178);
  pBVar1 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_c8);
  if (pBVar1 == (BrandedDecl *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pBVar1 = kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::operator->
                       ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_c8);
    this_local._7_1_ = BrandedDecl::compileAsType(pBVar1,this->errorReporter,target);
  }
  kj::_::NullableValue<capnp::compiler::NodeTranslator::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::NodeTranslator::BrandedDecl> *)local_c8);
  return this_local._7_1_;
}

Assistant:

bool NodeTranslator::compileType(Expression::Reader source, schema::Type::Builder target,
                                 ImplicitParams implicitMethodParams) {
  KJ_IF_MAYBE(decl, compileDeclExpression(source, implicitMethodParams)) {
    return decl->compileAsType(errorReporter, target);
  } else {
    return false;
  }
}